

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CGL::Application::load(Application *this,SceneInfo *sceneInfo)

{
  Type TVar1;
  pointer pNVar2;
  LightInfo *light;
  Vector3D VVar3;
  Vector3D VVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  Scene *this_00;
  Matrix4x4 *extraout_RDX;
  Matrix4x4 *extraout_RDX_00;
  Matrix4x4 *pMVar8;
  ulong uVar9;
  Application *this_01;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined8 uVar20;
  double dVar21;
  double dVar22;
  SceneLight *local_1c8;
  double dStack_1c0;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_198;
  double local_178;
  double dStack_170;
  double local_168;
  undefined1 local_158 [16];
  double local_148;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_138;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> objects;
  vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> lights;
  _Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> local_c8;
  _Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> local_b0;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  Vector4D local_58;
  
  lights.super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lights.super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lights.super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8 = (SceneLight *)0x0;
  dStack_1c0 = 0.0;
  objects.
  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objects.
  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objects.
  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = ((long)(sceneInfo->nodes).
                 super__Vector_base<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish -
          (long)(sceneInfo->nodes).
                super__Vector_base<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>._M_impl.
                super__Vector_impl_data._M_start) / 0xd0;
  uVar9 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar9;
  }
  dVar22 = 0.0;
  dVar19 = 0.0;
  dVar21 = 0.0;
  uVar20 = 0.0;
  this_01 = this;
  for (; uVar7 * 0xd0 - uVar9 != 0; uVar9 = uVar9 + 0xd0) {
    pNVar2 = (sceneInfo->nodes).
             super__Vector_base<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    light = *(LightInfo **)((long)(pNVar2->transform).entries + uVar9 + 0xfffffffffffffff0);
    TVar1 = (light->super_Instance).type;
    if (TVar1 < MATERIAL) {
      pMVar8 = (Matrix4x4 *)((long)(pNVar2->transform).entries + uVar9);
      switch(TVar1) {
      case CAMERA:
        local_138.field_0.x = (double)local_1c8;
        local_138.field_0.y = dStack_1c0;
        local_138.field_0.w = 1.0;
        local_138.field_0.z = (double)uVar20;
        Matrix4x4::operator*(pMVar8,(Vector4D *)&local_138.field_0);
        Vector4D::to3D(&local_58);
        local_1c8 = (SceneLight *)local_198.field_0.x;
        dStack_1c0 = local_198.field_0.y;
        local_138.field_0.x = (light->spectrum).field_0.field_0.x;
        local_138.field_0.y = (light->spectrum).field_0.field_0.y;
        local_138.field_0.z = (light->spectrum).field_0.field_0.z;
        local_138.field_0.w = 1.0;
        uVar20 = local_198.field_0.z;
        Matrix4x4::operator*(pMVar8,(Vector4D *)&local_138.field_0);
        Vector4D::to3D(&local_58);
        auVar5._8_8_ = local_198.field_0.y;
        auVar5._0_8_ = local_198.field_0.x;
        auVar15 = vdppd_avx(auVar5,auVar5,0x31);
        dVar21 = local_198.field_0.z * local_198.field_0.z + auVar15._0_8_;
        if (dVar21 < 0.0) {
          dVar22 = sqrt(dVar21);
          pMVar8 = extraout_RDX_00;
        }
        else {
          auVar14._8_8_ = 0;
          auVar14._0_8_ = dVar21;
          auVar15 = vsqrtsd_avx(auVar14,auVar14);
          dVar22 = auVar15._0_8_;
          pMVar8 = extraout_RDX;
        }
        dVar22 = 1.0 / dVar22;
        dVar21 = dVar22 * local_198.field_0.x;
        dVar19 = dVar22 * local_198.field_0.y;
        dVar22 = dVar22 * local_198.field_0.z;
        this_01 = this;
        init_camera(this,(CameraInfo *)light,pMVar8);
        break;
      case LIGHT:
        local_198.field_0.x = (double)init_light(this_01,light,pMVar8);
        this_01 = (Application *)&lights;
        std::vector<CGL::GLScene::SceneLight*,std::allocator<CGL::GLScene::SceneLight*>>::
        emplace_back<CGL::GLScene::SceneLight*>
                  ((vector<CGL::GLScene::SceneLight*,std::allocator<CGL::GLScene::SceneLight*>> *)
                   this_01,(SceneLight **)&local_198);
        break;
      case SPHERE:
        local_198.field_0.x = (double)init_sphere(this_01,(SphereInfo *)light,pMVar8);
        this_01 = (Application *)&objects;
        std::vector<CGL::GLScene::SceneObject*,std::allocator<CGL::GLScene::SceneObject*>>::
        emplace_back<CGL::GLScene::SceneObject*>
                  ((vector<CGL::GLScene::SceneObject*,std::allocator<CGL::GLScene::SceneObject*>> *)
                   this_01,(SceneObject **)&local_198);
        break;
      case POLYMESH:
        local_198.field_0.x = (double)init_polymesh(this_01,(PolymeshInfo *)light,pMVar8);
        this_01 = (Application *)&objects;
        std::vector<CGL::GLScene::SceneObject*,std::allocator<CGL::GLScene::SceneObject*>>::
        emplace_back<CGL::GLScene::SceneObject*>
                  ((vector<CGL::GLScene::SceneObject*,std::allocator<CGL::GLScene::SceneObject*>> *)
                   this_01,(SceneObject **)&local_198);
      }
    }
  }
  this_00 = (Scene *)operator_new(0x50);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::vector
            ((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             &local_b0,&objects);
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::vector
            ((vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             &local_c8,&lights);
  GLScene::Scene::Scene
            (this_00,(vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                      *)&local_b0,
             (vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             &local_c8);
  this->scene = this_00;
  std::_Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::
  ~_Vector_base(&local_c8);
  std::_Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::
  ~_Vector_base(&local_b0);
  GLScene::Scene::get_bbox((BBox *)&local_198.field_0,this->scene);
  if ((local_178 <= local_198.field_0.x) && (dStack_170 <= local_198.field_0.y)) {
    if (local_168 <= local_198.field_0.z) {
      dVar17 = (local_178 + local_198.field_0.x) * 0.5;
      dVar18 = (dStack_170 + local_198.field_0.y) * 0.5;
      auVar15 = vdppd_avx(local_158,local_158,0x31);
      dVar13 = (local_168 + local_198.field_0.z) * 0.5;
      dVar10 = local_148 * local_148 + auVar15._0_8_;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar10;
        auVar15 = vsqrtsd_avx(auVar15,auVar15);
        dVar10 = auVar15._0_8_;
      }
      dVar10 = dVar10 * 0.5 * 1.5;
      this->canonical_view_distance = dVar10;
      dVar16 = dVar10 / 10.0;
      local_78 = dVar17;
      dStack_70 = dVar18;
      local_68 = dVar13;
      dVar11 = acos(dVar19);
      dVar12 = atan2(dVar21,dVar22);
      VVar3.field_0.field_0.y = dVar16;
      VVar3.field_0.field_0.x = dVar19;
      VVar3.field_0.field_0.z = dVar21;
      VVar3.field_0._24_8_ = dVar22;
      CGL::Camera::place(VVar3,dVar11,dVar12,dVar10 + dVar10,dVar16,dVar10 * 20.0);
      local_98 = dVar17;
      dStack_90 = dVar18;
      local_88 = dVar13;
      dVar19 = acos(dVar19);
      dVar13 = atan2(dVar21,dVar22);
      VVar4.field_0.field_0.y = dVar16;
      VVar4.field_0.field_0.x = dVar19;
      VVar4.field_0.field_0.z = dVar21;
      VVar4.field_0._24_8_ = dVar22;
      CGL::Camera::place(VVar4,dVar19,dVar13,dVar10 + dVar10,dVar16,dVar10 * 20.0);
      this->scroll_rate = this->canonical_view_distance / 10.0;
    }
  }
  GLScene::Scene::set_draw_styles
            (this->scene,&this->defaultStyle,&this->hoverStyle,&this->selectStyle);
  std::_Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::
  ~_Vector_base(&objects.
                 super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
               );
  std::_Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::
  ~_Vector_base(&lights.
                 super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
               );
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

  vector<Collada::Node>& nodes = sceneInfo->nodes;
  vector<GLScene::SceneLight *> lights;
  vector<GLScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node& node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4& transform = node.transform;

    switch(instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo*>(instance);
        c_pos = (transform * Vector4D(c_pos,1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir,1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT:
      {
        lights.push_back(
          init_light(static_cast<LightInfo&>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
          init_sphere(static_cast<SphereInfo&>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
          init_polymesh(static_cast<PolymeshInfo&>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo&>(*instance));
        break;
     }
  }

  scene = new GLScene::Scene(objects, lights);

  const BBox& bbox = scene->get_bbox();
  if (!bbox.empty()) {

    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target,
                          acos(c_dir.y),
                          atan2(c_dir.x, c_dir.z),
                          view_distance,
                          min_view_distance,
                          max_view_distance);

    camera.place(target,
                acos(c_dir.y),
                atan2(c_dir.x, c_dir.z),
                view_distance,
                min_view_distance,
                max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

}